

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Keyword.cpp
# Opt level: O1

void __thiscall ninx::lexer::token::Keyword::Keyword(Keyword *this,int line_number,string *keyword)

{
  pointer pcVar1;
  mapped_type mVar2;
  const_iterator cVar3;
  mapped_type *pmVar4;
  
  (this->super_Token).line_number = line_number;
  (this->super_Token)._vptr_Token = (_func_int **)&PTR__Keyword_00206a40;
  (this->keyword)._M_dataplus._M_p = (pointer)&(this->keyword).field_2;
  pcVar1 = (keyword->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->keyword,pcVar1,pcVar1 + keyword->_M_string_length);
  this->late = false;
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ninx::lexer::token::Type>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ninx::lexer::token::Type>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ninx::lexer::token::Type>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ninx::lexer::token::Type>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ninx::lexer::token::Type>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ninx::lexer::token::Type>_>_>
                  *)RESERVED_KEYWORDS_abi_cxx11_,keyword);
  if (cVar3._M_node == (_Base_ptr)(RESERVED_KEYWORDS_abi_cxx11_ + 8)) {
    mVar2 = FUNCNAME;
  }
  else {
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ninx::lexer::token::Type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ninx::lexer::token::Type>_>_>
             ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ninx::lexer::token::Type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ninx::lexer::token::Type>_>_>
                   *)RESERVED_KEYWORDS_abi_cxx11_,keyword);
    mVar2 = *pmVar4;
  }
  this->type = mVar2;
  return;
}

Assistant:

ninx::lexer::token::Keyword::Keyword(int line_number, const std::string &keyword) : Token(line_number), keyword(keyword) {
    if (RESERVED_KEYWORDS.count(keyword) > 0) {  // The given keyword is a reserved one, get the corresponding Type
        this->type = RESERVED_KEYWORDS.at(keyword);
    }else{
        this->type = Type::FUNCNAME;  // If a keyword is not reserved, then it is a function call
    }
}